

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_ins_var_nentry_test(void)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  undefined1 auStackY_148 [8];
  btree_kv_ops *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  void **in_stack_fffffffffffffed0;
  undefined1 auStack_c8 [8];
  void *key_ptr;
  key_len_t in_stack_ffffffffffffff4e;
  char *str;
  void **key_ptrs;
  char *pcStack_98;
  int n;
  char *keys [2];
  char *node_str;
  int local_78;
  int offset;
  int i;
  int cmp;
  idx_t idx;
  uint8_t v;
  uint8_t vsize;
  undefined1 *puStack_68;
  uint8_t ksize;
  btree_kv_ops *kv_ops;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  key_ptr = (void *)0x103655;
  memleak_start();
  pcStack_98 = "string";
  keys[0] = "longstring";
  for (local_78 = 0; local_78 < 2; local_78 = local_78 + 1) {
    str = *(char **)((long)&stack0xffffffffffffff68 + (long)local_78 * 8);
    strlen(*(char **)((long)&stack0xffffffffffffff68 + (long)local_78 * 8));
    construct_key_ptr(str,in_stack_ffffffffffffff4e,key_ptr);
  }
  sVar3 = strlen(pcStack_98);
  cmp._3_1_ = (char)sVar3 + '\x03';
  cmp._2_1_ = 1;
  kv_ops = (btree_kv_ops *)
           dummy_node((uint8_t)((ulong)key_ptr >> 0x38),(uint8_t)((ulong)key_ptr >> 0x30),
                      (uint16_t)((ulong)key_ptr >> 0x20));
  *(idx_t *)((long)&kv_ops->get_kv + 6) = 2;
  cmp._1_1_ = 'd';
  puStack_68 = auStackY_148;
  btree_str_kv_get_kb64_vb64(in_stack_fffffffffffffec0);
  (**(code **)(puStack_68 + 0x10))(kv_ops,0,auStack_c8,(long)&cmp + 1);
  cmp._1_1_ = cmp._1_1_ + '\x01';
  (**(code **)(puStack_68 + 0x10))(kv_ops,0,&stack0xffffffffffffff40,(long)&cmp + 1);
  keys[1] = (char *)(kv_ops->set_kv + 2);
  iVar1 = strcmp(keys[1],keys[0]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x285);
    kv_ins_var_nentry_test::__test_pass = 0;
    if (iVar1 != 0) {
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x285,"void kv_ins_var_nentry_test()");
    }
  }
  sVar3 = strlen(keys[0]);
  iVar2 = (int)sVar3 + 3;
  iVar1 = memcmp(kv_ops->set_kv + iVar2,(void *)((long)&cmp + 1),(ulong)cmp._2_1_);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x288);
    kv_ins_var_nentry_test::__test_pass = 0;
    if (iVar1 != 0) {
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x288,"void kv_ins_var_nentry_test()");
    }
  }
  cmp._1_1_ = cmp._1_1_ + -1;
  iVar2 = iVar2 + cmp._2_1_ + 2;
  keys[1] = (char *)(kv_ops->set_kv + iVar2);
  iVar1 = strcmp(keys[1],pcStack_98);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x28f);
    kv_ins_var_nentry_test::__test_pass = 0;
    if (iVar1 != 0) {
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x28f,"void kv_ins_var_nentry_test()");
    }
  }
  sVar3 = strlen(pcStack_98);
  iVar1 = memcmp(kv_ops->set_kv + (iVar2 + (int)sVar3 + 1),(void *)((long)&cmp + 1),(ulong)cmp._2_1_
                );
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x292);
    kv_ins_var_nentry_test::__test_pass = 0;
    if (iVar1 != 0) {
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x292,"void kv_ins_var_nentry_test()");
    }
  }
  free(kv_ops);
  freevars(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  memleak_end();
  if (kv_ins_var_nentry_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv_ins_var_nentry_test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv_ins_var_nentry_test");
  }
  return;
}

Assistant:

void kv_ins_var_nentry_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v;
    idx_t idx;
    int cmp, i, offset;
    char *node_str;

    const char *keys[] = {"string",
                          "longstring"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
    }

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    idx = 0;
    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // insert twice at beginning of node
    kv_ops->ins_kv(node, 0, &key_ptrs[idx], (void *)&v);
    idx++;
    v++;
    kv_ops->ins_kv(node, 0, &key_ptrs[idx], (void *)&(v));

    // verify k1 is at entry 0
    offset = sizeof(key_len_t);
    node_str = (char *)((uint8_t *)node->data + offset);
    cmp = strcmp(node_str, keys[1]);
    TEST_CHK(cmp == 0);
    offset += strlen(keys[1]) + 1;
    cmp = memcmp((uint8_t *)node->data + offset, &v, vsize);
    TEST_CHK(cmp == 0);

    v--;
    // verify k0 is at entry 1
    offset += vsize + sizeof(key_len_t);
    node_str = (char *)((uint8_t *)node->data + offset);
    cmp = strcmp(node_str, keys[0]);
    TEST_CHK(cmp == 0);
    offset += strlen(keys[0]) + 1;
    cmp = memcmp((uint8_t *)node->data + offset, &v, vsize);
    TEST_CHK(cmp == 0);

    free(node);
    freevars(key_ptrs, n);
    memleak_end();

    TEST_RESULT("kv_ins_var_nentry_test");
}